

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

qpTestResult __thiscall
gl4cts::ClipControlDepthModeOneToOneTest::ValidateFramebuffer
          (ClipControlDepthModeOneToOneTest *this,Context *context)

{
  RenderContext *pRVar1;
  TestLog *log;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  qpTestResult qVar4;
  int iVar5;
  int y;
  int x;
  float fVar6;
  Surface renderedColorFrame;
  Surface referenceColorFrame;
  TextureFormat depthFormat;
  TextureLevel referenceDepthFrame;
  TextureLevel renderedDepthFrame;
  Surface local_f8;
  ClipControlDepthModeOneToOneTest *local_e0;
  TestLog *local_d8;
  Surface local_d0;
  TextureFormat local_b8;
  TextureFormat local_b0;
  PixelBufferAccess local_a8;
  TextureLevel local_80;
  TextureLevel local_58;
  
  local_e0 = this;
  iVar3 = (*context->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar3 = ((int *)CONCAT44(extraout_var,iVar3))[1];
  tcu::Surface::Surface(&local_f8,iVar5,iVar3);
  tcu::Surface::Surface(&local_d0,iVar5,iVar3);
  local_b8.order = D;
  local_b8.type = FLOAT;
  tcu::TextureLevel::TextureLevel(&local_58,&local_b8,iVar5,iVar3,1);
  tcu::TextureLevel::TextureLevel(&local_80,&local_b8,iVar5,iVar3,1);
  local_d8 = context->m_testCtx->m_log;
  iVar5 = local_f8.m_width;
  iVar3 = local_f8.m_height;
  if (0 < local_f8.m_height) {
    y = 0;
    do {
      if (0 < iVar5) {
        fVar6 = (float)iVar3;
        x = 0;
        do {
          *(undefined4 *)((long)local_d0.m_pixels.m_ptr + (long)(local_d0.m_width * y + x) * 4) =
               0xff00ff00;
          tcu::TextureLevel::getAccess(&local_a8,&local_80);
          tcu::PixelBufferAccess::setPixDepth
                    (&local_a8,((float)x / (float)iVar5 + (float)y / fVar6) * 0.5,x,y,0);
          x = x + 1;
          iVar5 = local_f8.m_width;
          iVar3 = local_f8.m_height;
        } while (x < local_f8.m_width);
      }
      y = y + 1;
    } while (y < iVar3);
  }
  pRVar1 = context->m_renderCtx;
  local_b0.order = RGBA;
  local_b0.type = UNORM_INT8;
  if ((void *)local_f8.m_pixels.m_cap != (void *)0x0) {
    local_f8.m_pixels.m_cap = (size_t)local_f8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_a8,&local_b0,iVar5,iVar3,1,(void *)local_f8.m_pixels.m_cap);
  log = local_d8;
  glu::readPixels(pRVar1,0,0,&local_a8);
  qVar4 = QP_TEST_RESULT_FAIL;
  bVar2 = tcu::fuzzyCompare(log,"Result","Color image comparison result",&local_d0,&local_f8,0.05,
                            COMPARE_LOG_RESULT);
  if (bVar2) {
    pRVar1 = context->m_renderCtx;
    tcu::TextureLevel::getAccess(&local_a8,&local_58);
    glu::readPixels(pRVar1,0,0,&local_a8);
    bVar2 = ClipControlRenderBaseTest::fuzzyDepthCompare
                      (&local_e0->super_ClipControlRenderBaseTest,log,"Result",
                       "Depth image comparison result",&local_80,&local_58,0.05,(TextureLevel *)0x0)
    ;
    qVar4 = (qpTestResult)!bVar2;
  }
  tcu::TextureLevel::~TextureLevel(&local_80);
  tcu::TextureLevel::~TextureLevel(&local_58);
  tcu::Surface::~Surface(&local_d0);
  tcu::Surface::~Surface(&local_f8);
  return qVar4;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedColorFrame(viewportW, viewportH);
		tcu::Surface			 referenceColorFrame(viewportW, viewportH);
		tcu::TextureFormat		 depthFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
		tcu::TextureLevel		 renderedDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 referenceDepthFrame(depthFormat, viewportW, viewportH);

		tcu::TestLog& log = context.getTestContext().getLog();

		for (int y = 0; y < renderedColorFrame.getHeight(); y++)
		{
			float yCoord = (float)(y) / (float)renderedColorFrame.getHeight();
			for (int x = 0; x < renderedColorFrame.getWidth(); x++)
			{
				float xCoord = (float)(x) / (float)renderedColorFrame.getWidth();

				referenceColorFrame.setPixel(x, y, tcu::RGBA::green());
				referenceDepthFrame.getAccess().setPixDepth((xCoord + yCoord) * 0.5f, x, y);
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedColorFrame.getAccess());
		if (!tcu::fuzzyCompare(log, "Result", "Color image comparison result", referenceColorFrame, renderedColorFrame,
							   0.05f, tcu::COMPARE_LOG_RESULT))
		{

			return QP_TEST_RESULT_FAIL;
		}
		glu::readPixels(context.getRenderContext(), 0, 0, renderedDepthFrame.getAccess());
		if (!fuzzyDepthCompare(log, "Result", "Depth image comparison result", referenceDepthFrame, renderedDepthFrame,
							   0.05f))
		{

			return QP_TEST_RESULT_FAIL;
		}

		return QP_TEST_RESULT_PASS;
	}